

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_malloc.h
# Opt level: O1

void __thiscall
vector_malloc_counter_clear<unsigned_long,_16U>::grow
          (vector_malloc_counter_clear<unsigned_long,_16U> *this)

{
  size_t sVar1;
  unsigned_long *__src;
  unsigned_long *__dest;
  
  sVar1 = this->_capacity;
  if (sVar1 == 0) {
    this->_capacity = 0x10;
    __dest = (unsigned_long *)malloc(0x80);
  }
  else {
    this->_capacity = sVar1 * 2;
    __dest = (unsigned_long *)malloc(sVar1 << 4);
    __src = this->_data;
    memcpy(__dest,__src,this->_size << 3);
    free(__src);
  }
  this->_data = __dest;
  return;
}

Assistant:

void grow()
	{
		if (_capacity == 0) {
			_capacity = InitialSize;
			_data = static_cast<T*>(malloc(_capacity*sizeof(T)));
		} else {
			_capacity <<= 1;
			T* t = static_cast<T*>(malloc(_capacity*sizeof(T)));
			(void) memcpy(t, _data, _size*sizeof(T));
			free(_data);
			_data = t;
		}
	}